

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine_ft.cpp
# Opt level: O3

int __thiscall QFontEngineFT::synthesized(QFontEngineFT *this)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = *(ulong *)&(this->super_QFontEngine).fontDef.field_0x60;
  if ((uVar1 & 0x30000000) == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = ~(uint)this->freetype->face->style_flags & 1;
  }
  if (0x2bb0000000000 < (uVar1 & 0x3fc0000000000)) {
    uVar2 = uVar2 | ~(uint)this->freetype->face->style_flags & 2;
  }
  if (((uint)uVar1 & 0xfff0000) != 0x640000) {
    uVar2 = uVar2 + ((uint)this->freetype->face->face_flags & 1) * 4;
  }
  return uVar2;
}

Assistant:

int QFontEngineFT::synthesized() const
{
    int s = 0;
    if ((fontDef.style != QFont::StyleNormal) && !(freetype->face->style_flags & FT_STYLE_FLAG_ITALIC))
        s = SynthesizedItalic;
    if ((fontDef.weight >= QFont::Bold) && !(freetype->face->style_flags & FT_STYLE_FLAG_BOLD))
        s |= SynthesizedBold;
    if (fontDef.stretch != 100 && FT_IS_SCALABLE(freetype->face))
        s |= SynthesizedStretch;
    return s;
}